

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>_> __thiscall
wabt::MakeUnique<wasm_tabletype_t,wabt::interp::TableType&>(wabt *this,TableType *args)

{
  wasm_tabletype_t *this_00;
  TableType local_40;
  TableType *local_18;
  TableType *args_local;
  
  local_18 = args;
  args_local = (TableType *)this;
  this_00 = (wasm_tabletype_t *)operator_new(0x20);
  interp::TableType::TableType(&local_40,local_18);
  wasm_tabletype_t::wasm_tabletype_t(this_00,&local_40);
  std::unique_ptr<wasm_tabletype_t,std::default_delete<wasm_tabletype_t>>::
  unique_ptr<std::default_delete<wasm_tabletype_t>,void>
            ((unique_ptr<wasm_tabletype_t,std::default_delete<wasm_tabletype_t>> *)this,this_00);
  interp::TableType::~TableType(&local_40);
  return (__uniq_ptr_data<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}